

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  uint uVar5;
  _func_void_int_int *p_Var6;
  ImGuiWindow **ppIVar7;
  ImGuiWindow *pIVar8;
  ImVec2 IVar9;
  bool bVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  ImGuiWindow **ppIVar13;
  ImGuiWindow *pIVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  
  pIVar11 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xff1,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  p_Var6 = (GImGui->IO).ImeSetInputScreenPosFn;
  if (p_Var6 != (_func_void_int_int *)0x0) {
    fVar1 = (GImGui->PlatformImePos).x;
    fVar2 = (GImGui->PlatformImePos).y;
    fVar18 = (GImGui->PlatformImeLastPos).x - fVar1;
    fVar19 = (GImGui->PlatformImeLastPos).y - fVar2;
    if (0.0001 < fVar18 * fVar18 + fVar19 * fVar19) {
      (*p_Var6)((int)fVar1,(int)fVar2);
      pIVar11->PlatformImeLastPos = pIVar11->PlatformImePos;
    }
  }
  if ((pIVar11->CurrentWindowStack).Size != 1) {
    __assert_fail("g.CurrentWindowStack.Size == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xffd,"void ImGui::EndFrame()");
  }
  pIVar14 = pIVar11->CurrentWindow;
  if ((pIVar14 != (ImGuiWindow *)0x0) && (pIVar14->WriteAccessed == false)) {
    pIVar14->Active = false;
  }
  End();
  if (((pIVar11->ActiveId != 0) || (pIVar11->HoveredId != 0)) ||
     ((pIVar14 = pIVar11->NavWindow, pIVar14 != (ImGuiWindow *)0x0 && (pIVar14->Appearing != false))
     )) goto LAB_0017dbae;
  if ((pIVar11->IO).MouseClicked[0] == true) {
    if (pIVar11->HoveredRootWindow == (ImGuiWindow *)0x0) {
      if (((pIVar14 != (ImGuiWindow *)0x0) &&
          (pIVar14 = GetFrontMostPopupModal(), pIVar12 = GImGui, pIVar14 == (ImGuiWindow *)0x0)) &&
         (GImGui->NavWindow != (ImGuiWindow *)0x0)) {
        GImGui->NavWindow = (ImGuiWindow *)0x0;
        pIVar12->NavInitRequest = false;
        pIVar12->NavId = 0;
        pIVar12->NavIdIsAlive = false;
        pIVar12->NavLayer = 0;
      }
    }
    else {
      FocusWindow(pIVar11->HoveredWindow);
      SetActiveID(pIVar11->HoveredWindow->MoveId,pIVar11->HoveredWindow);
      pIVar11->NavDisableHighlight = true;
      IVar3 = (pIVar11->IO).MousePos;
      IVar4 = pIVar11->HoveredRootWindow->Pos;
      IVar9.y = IVar3.y - IVar4.y;
      IVar9.x = IVar3.x - IVar4.x;
      pIVar11->ActiveIdClickOffset = IVar9;
      if (((pIVar11->HoveredWindow->Flags & 4) == 0) &&
         ((pIVar11->HoveredRootWindow->Flags & 4) == 0)) {
        pIVar11->MovingWindow = pIVar11->HoveredWindow;
      }
    }
  }
  if ((pIVar11->IO).MouseClicked[1] != true) goto LAB_0017dbae;
  pIVar14 = GetFrontMostPopupModal();
  uVar15 = (ulong)(pIVar11->Windows).Size;
  if ((long)uVar15 < 1 || pIVar14 == (ImGuiWindow *)0x0) {
    if (pIVar14 == (ImGuiWindow *)0x0) {
LAB_0017def6:
      pIVar14 = pIVar11->HoveredWindow;
    }
  }
  else {
    bVar10 = false;
    while (pIVar8 = (pIVar11->Windows).Data[uVar15 - 1], pIVar8 != pIVar14) {
      if (pIVar8 == pIVar11->HoveredWindow) {
        bVar10 = true;
      }
      if ((uVar15 < 2) || (uVar15 = uVar15 - 1, bVar10)) break;
    }
    if (bVar10) goto LAB_0017def6;
  }
  ClosePopupsOverWindow(pIVar14);
LAB_0017dbae:
  iVar16 = (pIVar11->WindowsSortBuffer).Capacity;
  if (iVar16 < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    iVar16 = 0;
    ppIVar13 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar7 = (pIVar11->WindowsSortBuffer).Data;
    if (ppIVar7 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar13,ppIVar7,(long)(pIVar11->WindowsSortBuffer).Size << 3);
      ppIVar7 = (pIVar11->WindowsSortBuffer).Data;
      if (ppIVar7 != (ImGuiWindow **)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(ppIVar7,GImAllocatorUserData);
    }
    (pIVar11->WindowsSortBuffer).Data = ppIVar13;
    (pIVar11->WindowsSortBuffer).Capacity = 0;
  }
  (pIVar11->WindowsSortBuffer).Size = 0;
  uVar5 = (pIVar11->Windows).Size;
  uVar15 = (ulong)uVar5;
  if (iVar16 < (int)uVar5) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    ppIVar13 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar15 * 8,GImAllocatorUserData);
    ppIVar7 = (pIVar11->WindowsSortBuffer).Data;
    if (ppIVar7 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar13,ppIVar7,(long)(pIVar11->WindowsSortBuffer).Size << 3);
      ppIVar7 = (pIVar11->WindowsSortBuffer).Data;
      if (ppIVar7 != (ImGuiWindow **)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(ppIVar7,GImAllocatorUserData);
    }
    (pIVar11->WindowsSortBuffer).Data = ppIVar13;
    (pIVar11->WindowsSortBuffer).Capacity = uVar5;
    uVar15 = (ulong)(uint)(pIVar11->Windows).Size;
  }
  if ((int)uVar15 == 0) {
    iVar16 = 0;
  }
  else {
    uVar17 = 0;
    do {
      if ((long)(int)uVar15 <= (long)uVar17) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4c0,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar14 = (pIVar11->Windows).Data[uVar17];
      if ((pIVar14->Active != true) || ((pIVar14->Flags & 0x1000000) == 0)) {
        AddWindowToSortedBuffer(&pIVar11->WindowsSortBuffer,pIVar14);
        uVar15 = (ulong)(uint)(pIVar11->Windows).Size;
      }
      uVar17 = uVar17 + 1;
      iVar16 = (int)uVar15;
    } while (uVar17 != uVar15);
  }
  if (iVar16 == (pIVar11->WindowsSortBuffer).Size) {
    (pIVar11->Windows).Size = iVar16;
    iVar16 = (pIVar11->WindowsSortBuffer).Capacity;
    (pIVar11->WindowsSortBuffer).Capacity = (pIVar11->Windows).Capacity;
    (pIVar11->Windows).Capacity = iVar16;
    ppIVar7 = (pIVar11->WindowsSortBuffer).Data;
    (pIVar11->WindowsSortBuffer).Data = (pIVar11->Windows).Data;
    (pIVar11->Windows).Data = ppIVar7;
    (pIVar11->IO).MouseWheel = 0.0;
    (pIVar11->IO).MouseWheelH = 0.0;
    (pIVar11->IO).InputCharacters[0] = 0;
    (pIVar11->IO).InputCharacters[1] = 0;
    (pIVar11->IO).InputCharacters[2] = 0;
    (pIVar11->IO).InputCharacters[3] = 0;
    (pIVar11->IO).InputCharacters[4] = 0;
    (pIVar11->IO).InputCharacters[5] = 0;
    (pIVar11->IO).InputCharacters[6] = 0;
    (pIVar11->IO).InputCharacters[7] = 0;
    (pIVar11->IO).InputCharacters[8] = 0;
    (pIVar11->IO).InputCharacters[9] = 0;
    (pIVar11->IO).InputCharacters[10] = 0;
    (pIVar11->IO).InputCharacters[0xb] = 0;
    (pIVar11->IO).InputCharacters[0xc] = 0;
    (pIVar11->IO).InputCharacters[0xd] = 0;
    (pIVar11->IO).InputCharacters[0xe] = 0;
    (pIVar11->IO).InputCharacters[0xf] = 0;
    *(undefined8 *)((pIVar11->IO).InputCharacters + 0x10) = 0;
    *(undefined8 *)((long)(pIVar11->IO).NavInputs + 6) = 0;
    *(undefined8 *)((long)(pIVar11->IO).NavInputs + 0xe) = 0;
    *(undefined8 *)((long)(pIVar11->IO).NavInputs + 0x16) = 0;
    *(undefined8 *)((long)(pIVar11->IO).NavInputs + 0x1e) = 0;
    *(undefined8 *)((long)(pIVar11->IO).NavInputs + 0x26) = 0;
    *(undefined8 *)((long)(pIVar11->IO).NavInputs + 0x2e) = 0;
    *(undefined8 *)((long)(pIVar11->IO).NavInputs + 0x36) = 0;
    *(undefined8 *)((long)(pIVar11->IO).NavInputs + 0x3e) = 0;
    *(undefined8 *)((long)(pIVar11->IO).NavInputs + 0x46) = 0;
    (pIVar11->IO).NavInputs[0x13] = 0.0;
    (pIVar11->IO).NavInputs[0x14] = 0.0;
    pIVar11->FrameCountEnded = pIVar11->FrameCount;
    return;
  }
  __assert_fail("g.Windows.Size == g.WindowsSortBuffer.Size",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x103d,"void ImGui::EndFrame()");
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);                       // Forgot to call ImGui::NewFrame()
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f)
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit "Debug" window if it hasn't been used
    IM_ASSERT(g.CurrentWindowStack.Size == 1);    // Mismatched Begin()/End() calls, did you forget to call end on g.CurrentWindow->Name?
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    if (g.ActiveId == 0 && g.HoveredId == 0)
    {
        if (!g.NavWindow || !g.NavWindow->Appearing) // Unless we just made a window/popup appear
        {
            // Click to focus window and start moving (after we're done with all our widgets)
            if (g.IO.MouseClicked[0])
            {
                if (g.HoveredRootWindow != NULL)
                {
                    // Set ActiveId even if the _NoMove flag is set, without it dragging away from a window with _NoMove would activate hover on other windows.
                    FocusWindow(g.HoveredWindow);
                    SetActiveID(g.HoveredWindow->MoveId, g.HoveredWindow);
                    g.NavDisableHighlight = true;
                    g.ActiveIdClickOffset = g.IO.MousePos - g.HoveredRootWindow->Pos;
                    if (!(g.HoveredWindow->Flags & ImGuiWindowFlags_NoMove) && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoMove))
                        g.MovingWindow = g.HoveredWindow;
                }
                else if (g.NavWindow != NULL && GetFrontMostPopupModal() == NULL)
                {
                    // Clicking on void disable focus
                    FocusWindow(NULL);
                }
            }

            // With right mouse button we close popups without changing focus
            // (The left mouse button path calls FocusWindow which will lead NewFrame->ClosePopupsOverWindow to trigger)
            if (g.IO.MouseClicked[1])
            {
                // Find the top-most window between HoveredWindow and the front most Modal Window.
                // This is where we can trim the popup stack.
                ImGuiWindow* modal = GetFrontMostPopupModal();
                bool hovered_window_above_modal = false;
                if (modal == NULL)
                    hovered_window_above_modal = true;
                for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
                {
                    ImGuiWindow* window = g.Windows[i];
                    if (window == modal)
                        break;
                    if (window == g.HoveredWindow)
                        hovered_window_above_modal = true;
                }
                ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal);
            }
        }
    }

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortedBuffer(&g.WindowsSortBuffer, window);
    }

    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);  // we done something wrong
    g.Windows.swap(g.WindowsSortBuffer);

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    memset(g.IO.InputCharacters, 0, sizeof(g.IO.InputCharacters));
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    g.FrameCountEnded = g.FrameCount;
}